

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynFunctionDefinition * ParseFunctionDefinition(ParseContext *ctx)

{
  IntrusiveList<SynIdentifier> aliases_00;
  IntrusiveList<SynIdentifier> aliases_01;
  IntrusiveList<SynBase> expressions_00;
  InplaceStr name_00;
  undefined4 uVar1;
  bool bVar2;
  bool isOperator_00;
  bool bVar3;
  LexemeType LVar4;
  bool *pbVar6;
  SynBase *node;
  int iVar5;
  SynIdentifier *pSVar7;
  Lexeme *pLVar8;
  Lexeme *pLVar9;
  ParseContext *pPVar10;
  InplaceStr IVar11;
  IntrusiveList<SynFunctionArgument> arguments_00;
  IntrusiveList<SynBase> IVar12;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a8 [8];
  TraceScope traceScope;
  undefined1 auStack_158 [8];
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynFunctionArgument> arguments;
  InplaceStr name_4;
  IntrusiveList<SynIdentifier> aliases;
  InplaceStr name_3;
  InplaceStr name_2;
  undefined1 local_a0 [8];
  InplaceStr name_1;
  undefined1 local_80 [8];
  InplaceStr name;
  SynIdentifier *nameIdentifier;
  bool isOperator;
  bool allowEmptyName;
  SynBase *pSStack_60;
  bool accessor;
  SynBase *parentType;
  Lexeme *subLexeme;
  SynBase *returnType;
  bool coroutine;
  Lexeme *pLStack_40;
  Lexeme *start;
  ParseContext *ctx_local;
  
  pLStack_40 = ctx->currentLexeme;
  returnType._4_4_ = (int)((long)pLStack_40 - (long)ctx->firstLexeme >> 5) + 1;
  start = (Lexeme *)ctx;
  pbVar6 = SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
                     (&ctx->nonFunctionDefinitionLocations,(uint *)((long)&returnType + 4));
  if (pbVar6 == (bool *)0x0) {
    returnType._3_1_ = ParseContext::Consume((ParseContext *)start,lex_coroutine);
    node = ParseType((ParseContext *)start,(bool *)0x0,false);
    pLVar8 = start;
    if (node == (SynBase *)0x0) {
      if ((returnType._3_1_ & 1) != 0) {
        pLVar9 = ParseContext::Current((ParseContext *)start);
        anon_unknown.dwarf_fc7e::Stop
                  ((ParseContext *)pLVar8,pLVar9,
                   "ERROR: function return type not found after \'coroutine\'");
      }
      ctx_local = (ParseContext *)0x0;
    }
    else {
      LVar4 = start[0x22].type;
      uVar1 = *(undefined4 *)&start[0x22].field_0x4;
      pSStack_60 = ParseType((ParseContext *)start,(bool *)0x0,false);
      nameIdentifier._7_1_ = false;
      if (pSStack_60 != (SynBase *)0x0) {
        bVar2 = ParseContext::Consume((ParseContext *)start,lex_colon);
        if (bVar2) {
          nameIdentifier._7_1_ = false;
        }
        else {
          nameIdentifier._7_1_ = ParseContext::Consume((ParseContext *)start,lex_point);
          if (!nameIdentifier._7_1_) {
            start[0x22].type = LVar4;
            *(undefined4 *)&start[0x22].field_0x4 = uVar1;
            pSStack_60 = (SynBase *)0x0;
          }
        }
      }
      bVar2 = isType<SynTypeAuto>(node);
      isOperator_00 = ParseContext::Consume((ParseContext *)start,lex_operator);
      name.end = (char *)0x0;
      if (isOperator_00) {
        bVar3 = ParseContext::Consume((ParseContext *)start,lex_obracket);
        if (bVar3) {
          anon_unknown.dwarf_fc7e::CheckConsume
                    ((ParseContext *)start,lex_cbracket,
                     "ERROR: \']\' not found after \'[\' in operator definition");
          InplaceStr::InplaceStr((InplaceStr *)local_80,"[]");
          pSVar7 = ParseContext::get<SynIdentifier>((ParseContext *)start);
          pLVar8 = ParseContext::Previous((ParseContext *)start);
          pLVar9 = ParseContext::Previous((ParseContext *)start);
          name_1.end = (char *)local_80;
          IVar11.end = name.begin;
          IVar11.begin = (char *)local_80;
          SynIdentifier::SynIdentifier(pSVar7,pLVar8,pLVar9,IVar11);
          name.end = (char *)pSVar7;
        }
        else {
          bVar3 = ParseContext::Consume((ParseContext *)start,lex_oparen);
          if (bVar3) {
            anon_unknown.dwarf_fc7e::CheckConsume
                      ((ParseContext *)start,lex_cparen,
                       "ERROR: \')\' not found after \'(\' in operator definition");
            InplaceStr::InplaceStr((InplaceStr *)local_a0,"()");
            pSVar7 = ParseContext::get<SynIdentifier>((ParseContext *)start);
            pLVar8 = ParseContext::Previous((ParseContext *)start);
            pLVar9 = ParseContext::Previous((ParseContext *)start);
            name_00.end = name_1.begin;
            name_00.begin = (char *)local_a0;
            SynIdentifier::SynIdentifier(pSVar7,pLVar8,pLVar9,name_00);
            name.end = (char *)pSVar7;
          }
          else {
            LVar4 = ParseContext::Peek((ParseContext *)start);
            if (((((int)LVar4 < 9) ||
                 (LVar4 = ParseContext::Peek((ParseContext *)start), 0x1d < (int)LVar4)) &&
                ((LVar4 = ParseContext::Peek((ParseContext *)start), (int)LVar4 < 0x1e ||
                 (LVar4 = ParseContext::Peek((ParseContext *)start), 0x29 < (int)LVar4)))) &&
               ((LVar4 = ParseContext::Peek((ParseContext *)start), LVar4 != lex_bitnot &&
                (LVar4 = ParseContext::Peek((ParseContext *)start), pLVar8 = start,
                LVar4 != lex_lognot)))) {
              pLVar9 = ParseContext::Current((ParseContext *)start);
              anon_unknown.dwarf_fc7e::Stop
                        ((ParseContext *)pLVar8,pLVar9,"ERROR: invalid operator name");
            }
            else {
              IVar11 = ParseContext::Consume((ParseContext *)start);
              pSVar7 = ParseContext::get<SynIdentifier>((ParseContext *)start);
              pLVar8 = ParseContext::Previous((ParseContext *)start);
              pLVar9 = ParseContext::Previous((ParseContext *)start);
              SynIdentifier::SynIdentifier(pSVar7,pLVar8,pLVar9,IVar11);
              name.end = (char *)pSVar7;
            }
          }
        }
      }
      else {
        bVar3 = ParseContext::At((ParseContext *)start,lex_string);
        pLVar8 = start;
        if (bVar3) {
          IVar11 = ParseContext::Consume((ParseContext *)start);
          pSVar7 = ParseContext::get<SynIdentifier>((ParseContext *)start);
          pLVar8 = ParseContext::Previous((ParseContext *)start);
          pLVar9 = ParseContext::Previous((ParseContext *)start);
          SynIdentifier::SynIdentifier(pSVar7,pLVar8,pLVar9,IVar11);
          name.end = (char *)pSVar7;
        }
        else if (pSStack_60 == (SynBase *)0x0) {
          if (((returnType._3_1_ & 1) != 0) && (!bVar2)) {
            pLVar9 = ParseContext::Current((ParseContext *)start);
            anon_unknown.dwarf_fc7e::Stop
                      ((ParseContext *)pLVar8,pLVar9,
                       "ERROR: function name not found after return type");
          }
        }
        else {
          pLVar9 = ParseContext::Current((ParseContext *)start);
          anon_unknown.dwarf_fc7e::Stop
                    ((ParseContext *)pLVar8,pLVar9,
                     "ERROR: function name expected after \':\' or \'.\'");
        }
      }
      IntrusiveList<SynIdentifier>::IntrusiveList((IntrusiveList<SynIdentifier> *)&name_4.end);
      if ((name.end != (char *)0x0) &&
         (bVar3 = ParseContext::Consume((ParseContext *)start,lex_less), bVar3)) {
        do {
          bVar3 = IntrusiveList<SynIdentifier>::empty((IntrusiveList<SynIdentifier> *)&name_4.end);
          if (bVar3) {
            anon_unknown.dwarf_fc7e::CheckConsume
                      ((ParseContext *)start,lex_at,
                       "ERROR: \'@\' is expected before explicit generic type alias");
          }
          else {
            anon_unknown.dwarf_fc7e::CheckConsume
                      ((ParseContext *)start,lex_at,
                       "ERROR: \'@\' is expected after \',\' in explicit generic type alias list");
          }
          bVar3 = anon_unknown.dwarf_fc7e::CheckAt
                            ((ParseContext *)start,lex_string,
                             "ERROR: explicit generic type alias is expected after \'@\'");
          if (bVar3) {
            IVar11 = ParseContext::Consume((ParseContext *)start);
            pSVar7 = ParseContext::get<SynIdentifier>((ParseContext *)start);
            pLVar8 = ParseContext::Previous((ParseContext *)start);
            pLVar9 = ParseContext::Previous((ParseContext *)start);
            SynIdentifier::SynIdentifier(pSVar7,pLVar8,pLVar9,IVar11);
            IntrusiveList<SynIdentifier>::push_back
                      ((IntrusiveList<SynIdentifier> *)&name_4.end,pSVar7);
          }
          bVar3 = ParseContext::Consume((ParseContext *)start,lex_comma);
        } while (bVar3);
        anon_unknown.dwarf_fc7e::CheckConsume
                  ((ParseContext *)start,lex_greater,
                   "ERROR: \'>\' not found after explicit generic type alias list");
      }
      if (((pSStack_60 != (SynBase *)0x0) || ((returnType._3_1_ & 1) != 0)) ||
         (bVar3 = IntrusiveList<SynIdentifier>::empty((IntrusiveList<SynIdentifier> *)&name_4.end),
         !bVar3)) {
        anon_unknown.dwarf_fc7e::CheckAt
                  ((ParseContext *)start,lex_oparen,"ERROR: \'(\' expected after function name");
      }
      if (((name.end == (char *)0x0) && (!bVar2)) ||
         (bVar2 = ParseContext::Consume((ParseContext *)start,lex_oparen), !bVar2)) {
        *(Lexeme **)(start + 0x22) = pLStack_40;
        arguments.tail._4_4_ = (int)((long)pLStack_40 - *(long *)&start[0x21].column >> 5) + 1;
        arguments.tail._3_1_ = 1;
        SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
                  ((SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *)
                   (start + 0x91),(uint *)((long)&arguments.tail + 4),
                   (bool *)((long)&arguments.tail + 3));
        ctx_local = (ParseContext *)0x0;
      }
      else {
        arguments_00 = ParseFunctionArguments((ParseContext *)start);
        anon_unknown.dwarf_fc7e::CheckConsume
                  ((ParseContext *)start,lex_cparen,
                   "ERROR: \')\' not found after function variable list");
        if (name.end == (char *)0x0) {
          pSVar7 = ParseContext::get<SynIdentifier>((ParseContext *)start);
          InplaceStr::InplaceStr((InplaceStr *)&expressions.tail);
          SynIdentifier::SynIdentifier(pSVar7,stack0xfffffffffffffeb8);
          name.end = (char *)pSVar7;
        }
        IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)auStack_158);
        bVar2 = ParseContext::Consume((ParseContext *)start,lex_semicolon);
        if (bVar2) {
          pPVar10 = (ParseContext *)ParseContext::get<SynFunctionDefinition>((ParseContext *)start);
          pLVar8 = pLStack_40;
          pLVar9 = ParseContext::Previous((ParseContext *)start);
          IVar12.head._4_4_ = auStack_158._4_4_;
          IVar12.head._0_4_ = auStack_158._0_4_;
          IVar12.tail._4_4_ = expressions.head._4_4_;
          IVar12.tail._0_4_ = expressions.head._0_4_;
          aliases_00.tail = aliases.head;
          aliases_00.head = (SynIdentifier *)name_4.end;
          SynFunctionDefinition::SynFunctionDefinition
                    ((SynFunctionDefinition *)pPVar10,pLVar8,pLVar9,true,
                     (bool)(returnType._3_1_ & 1),pSStack_60,nameIdentifier._7_1_,node,isOperator_00
                     ,(SynIdentifier *)name.end,aliases_00,arguments_00,IVar12);
          ctx_local = pPVar10;
        }
        else {
          anon_unknown.dwarf_fc7e::CheckConsume
                    ((ParseContext *)start,lex_ofigure,
                     "ERROR: \'{\' not found after function header");
          if ((ParseFunctionDefinition(ParseContext&)::token == '\0') &&
             (iVar5 = __cxa_guard_acquire(&ParseFunctionDefinition(ParseContext&)::token),
             iVar5 != 0)) {
            ParseFunctionDefinition::token = NULLC::TraceGetToken("parse","ParseFunctionBody");
            __cxa_guard_release(&ParseFunctionDefinition(ParseContext&)::token);
          }
          NULLC::TraceScope::TraceScope((TraceScope *)local_1a8,ParseFunctionDefinition::token);
          if (name.end != (char *)0x0) {
            NULLC::TraceLabel(*(char **)(name.end + 0x40),*(char **)(name.end + 0x48));
          }
          IVar12 = ParseExpressions((ParseContext *)start);
          local_1b8 = IVar12.head._0_4_;
          uStack_1b4 = IVar12.head._4_4_;
          uStack_1b0 = IVar12.tail._0_4_;
          uStack_1ac = IVar12.tail._4_4_;
          auStack_158._0_4_ = local_1b8;
          auStack_158._4_4_ = uStack_1b4;
          expressions.head._0_4_ = uStack_1b0;
          expressions.head._4_4_ = uStack_1ac;
          anon_unknown.dwarf_fc7e::CheckConsume
                    ((ParseContext *)start,lex_cfigure,"ERROR: \'}\' not found after function body")
          ;
          pPVar10 = (ParseContext *)ParseContext::get<SynFunctionDefinition>((ParseContext *)start);
          pLVar8 = pLStack_40;
          pLVar9 = ParseContext::Previous((ParseContext *)start);
          expressions_00.head._4_4_ = auStack_158._4_4_;
          expressions_00.head._0_4_ = auStack_158._0_4_;
          expressions_00.tail._4_4_ = expressions.head._4_4_;
          expressions_00.tail._0_4_ = expressions.head._0_4_;
          aliases_01.tail = aliases.head;
          aliases_01.head = (SynIdentifier *)name_4.end;
          SynFunctionDefinition::SynFunctionDefinition
                    ((SynFunctionDefinition *)pPVar10,pLVar8,pLVar9,false,
                     (bool)(returnType._3_1_ & 1),pSStack_60,nameIdentifier._7_1_,node,isOperator_00
                     ,(SynIdentifier *)name.end,aliases_01,arguments_00,expressions_00);
          ctx_local = pPVar10;
          NULLC::TraceScope::~TraceScope((TraceScope *)local_1a8);
        }
      }
    }
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynFunctionDefinition *)ctx_local;
}

Assistant:

SynFunctionDefinition* ParseFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonFunctionDefinitionLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool coroutine = ctx.Consume(lex_coroutine);

	if(SynBase *returnType = ParseType(ctx))
	{
		// Check if this is a member function
		Lexeme *subLexeme = ctx.currentLexeme;

		SynBase *parentType = ParseType(ctx);
		bool accessor = false;

		if(parentType)
		{
			if(ctx.Consume(lex_colon))
			{
				accessor = false;
			}
			else if(ctx.Consume(lex_point))
			{
				accessor = true;
			}
			else
			{
				// Backtrack
				ctx.currentLexeme = subLexeme;

				parentType = NULL;
			}
		}

		bool allowEmptyName = isType<SynTypeAuto>(returnType);

		bool isOperator = ctx.Consume(lex_operator);

		SynIdentifier *nameIdentifier = NULL;

		if(isOperator)
		{
			if(ctx.Consume(lex_obracket))
			{
				CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after '[' in operator definition");

				InplaceStr name = InplaceStr("[]");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if(ctx.Consume(lex_oparen))
			{
				CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after '(' in operator definition");

				InplaceStr name = InplaceStr("()");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if((ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				Stop(ctx, ctx.Current(), "ERROR: invalid operator name");
			}
		}
		else if(ctx.At(lex_string))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else if(parentType)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name expected after ':' or '.'");
		}
		else if(coroutine && !allowEmptyName)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name not found after return type");
		}

		IntrusiveList<SynIdentifier> aliases;

		if(nameIdentifier && ctx.Consume(lex_less))
		{
			do
			{
				if(aliases.empty())
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected before explicit generic type alias");
				else
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected after ',' in explicit generic type alias list");

				if(CheckAt(ctx, lex_string, "ERROR: explicit generic type alias is expected after '@'"))
				{
					InplaceStr name = ctx.Consume();
					aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name));
				}
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, lex_greater, "ERROR: '>' not found after explicit generic type alias list");
		}

		if(parentType || coroutine || !aliases.empty())
			CheckAt(ctx, lex_oparen, "ERROR: '(' expected after function name");

		if((nameIdentifier == NULL && !allowEmptyName) || !ctx.Consume(lex_oparen))
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonFunctionDefinitionLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}

		IntrusiveList<SynFunctionArgument> arguments = ParseFunctionArguments(ctx);

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function variable list");

		if(!nameIdentifier)
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_semicolon))
			return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), true, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after function header");

		TRACE_SCOPE("parse", "ParseFunctionBody");

		if(nameIdentifier)
			TRACE_LABEL2(nameIdentifier->name.begin, nameIdentifier->name.end);

		expressions = ParseExpressions(ctx);

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");

		return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), false, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);
	}
	else if(coroutine)
	{
		Stop(ctx, ctx.Current(), "ERROR: function return type not found after 'coroutine'");
	}

	return NULL;
}